

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_quic_transport_params_add_clienthello_impl
               (SSL_HANDSHAKE *hs,CBB *out,bool use_legacy_codepoint)

{
  int iVar1;
  uint uVar2;
  uint16_t value;
  CBB contents;
  CBB CStack_48;
  
  if ((hs->config->quic_transport_params).size_ == 0) {
    iVar1 = SSL_is_quic(hs->ssl);
    if (iVar1 == 0) {
      return true;
    }
    if ((hs->config->quic_transport_params).size_ == 0) goto LAB_0013b782;
  }
  iVar1 = SSL_is_quic(hs->ssl);
  if (iVar1 != 0) {
    if (hs->min_version < 0x304) {
      __assert_fail("hs->min_version > TLS1_2_VERSION",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xac4,
                    "bool bssl::ext_quic_transport_params_add_clienthello_impl(const SSL_HANDSHAKE *, CBB *, bool)"
                   );
    }
    uVar2 = *(ushort *)&hs->config->field_0x10d & 0x200;
    if ((ushort)(uVar2 >> 9) != (ushort)use_legacy_codepoint) {
      return true;
    }
    value = 0xffa5;
    if ((short)uVar2 == 0) {
      value = 0x39;
    }
    iVar1 = CBB_add_u16(out,value);
    if (((iVar1 != 0) && (iVar1 = CBB_add_u16_length_prefixed(out,&CStack_48), iVar1 != 0)) &&
       (iVar1 = CBB_add_bytes(&CStack_48,(hs->config->quic_transport_params).data_,
                              (hs->config->quic_transport_params).size_), iVar1 != 0)) {
      iVar1 = CBB_flush(out);
      return iVar1 != 0;
    }
    return false;
  }
LAB_0013b782:
  ERR_put_error(0x10,0,0x131,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                ,0xac1);
  return false;
}

Assistant:

static bool ext_quic_transport_params_add_clienthello_impl(
    const SSL_HANDSHAKE *hs, CBB *out, bool use_legacy_codepoint) {
  if (hs->config->quic_transport_params.empty() && !SSL_is_quic(hs->ssl)) {
    return true;
  }
  if (hs->config->quic_transport_params.empty() || !SSL_is_quic(hs->ssl)) {
    // QUIC Transport Parameters must be sent over QUIC, and they must not be
    // sent over non-QUIC transports. If transport params are set, then
    // SSL(_CTX)_set_quic_method must also be called.
    OPENSSL_PUT_ERROR(SSL, SSL_R_QUIC_TRANSPORT_PARAMETERS_MISCONFIGURED);
    return false;
  }
  assert(hs->min_version > TLS1_2_VERSION);
  if (use_legacy_codepoint != hs->config->quic_use_legacy_codepoint) {
    // Do nothing, we'll send the other codepoint.
    return true;
  }

  uint16_t extension_type = TLSEXT_TYPE_quic_transport_parameters;
  if (hs->config->quic_use_legacy_codepoint) {
    extension_type = TLSEXT_TYPE_quic_transport_parameters_legacy;
  }

  CBB contents;
  if (!CBB_add_u16(out, extension_type) ||
      !CBB_add_u16_length_prefixed(out, &contents) ||
      !CBB_add_bytes(&contents, hs->config->quic_transport_params.data(),
                     hs->config->quic_transport_params.size()) ||
      !CBB_flush(out)) {
    return false;
  }
  return true;
}